

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O3

void helicsFilterSetOption(HelicsFilter filt,int option,int value,HelicsError *err)

{
  FilterObject *pFVar1;
  
  pFVar1 = anon_unknown.dwarf_ba607::getFilterObj(filt,err);
  if (pFVar1 != (FilterObject *)0x0) {
    (*(pFVar1->filtPtr->super_Interface)._vptr_Interface[2])
              (pFVar1->filtPtr,(ulong)(uint)option,(ulong)(uint)value);
  }
  return;
}

Assistant:

void helicsFilterSetOption(HelicsFilter filt, int option, int value, HelicsError* err)
{
    auto* filtObj = getFilterObj(filt, err);
    if (filtObj == nullptr) {
        return;
    }
    try {
        filtObj->filtPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}